

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void checkLinkError(GLuint program)

{
  ulong uVar1;
  uint in_EAX;
  int iVar2;
  char *__s;
  size_t sVar3;
  undefined4 in_register_0000003c;
  GLint logSize;
  GLint success;
  undefined8 local_28;
  
  local_28 = (ulong)in_EAX;
  (*__glewGetProgramiv)(CONCAT44(in_register_0000003c,program),0x8b82,(long)&local_28 + 4);
  if (local_28._4_4_ == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Shader link failed.",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    local_28 = local_28 & 0xffffffff00000000;
    (*__glewGetProgramiv)(program,0x8b84,&local_28);
    uVar1 = local_28;
    if ((int)local_28 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No log found.",0xd);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
    }
    else {
      iVar2 = -1;
      if (-1 < (int)local_28) {
        iVar2 = (int)local_28;
      }
      __s = (char *)operator_new__((long)iVar2);
      (*__glewGetProgramInfoLog)(program,uVar1 & 0xffffffff,&local_28,__s);
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      operator_delete__(__s);
    }
  }
  return;
}

Assistant:

void checkLinkError(GLuint program) {
    GLint success = 0;
    glGetProgramiv(program, GL_LINK_STATUS, &success);
    if (success) return;

    cout << "Shader link failed." << endl;

    GLint logSize = 0;
    glGetProgramiv(program, GL_INFO_LOG_LENGTH, &logSize);
    if (logSize == 0) {
        cout << "No log found." << endl;
        return;
    }

    GLchar *log = new GLchar[logSize];

    glGetProgramInfoLog(program, logSize, &logSize, log);
    cout << log << endl;

    delete[] log;
}